

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Int.cpp
# Opt level: O1

string * __thiscall Lib::Int::toString_abi_cxx11_(string *__return_storage_ptr__,Int *this,long l)

{
  size_t sVar1;
  char tmp [256];
  char acStack_118 [264];
  
  snprintf(acStack_118,0x100,"%ld",this);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  sVar1 = strlen(acStack_118);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,acStack_118,acStack_118 + sVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string Int::toString(long l)
{
  constexpr auto BUFSIZE = 256;
  char tmp [BUFSIZE];
  snprintf(tmp,BUFSIZE,"%ld",l);
  std::string result(tmp);

  return result;
}